

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O3

void __thiscall
Am_Drawonable_Impl::Bitblt
          (Am_Drawonable_Impl *this,int d_left,int d_top,int width,int height,Am_Drawonable *source,
          int s_left,int s_top,Am_Draw_Function df)

{
  Window WVar1;
  Display *pDVar2;
  GC p_Var3;
  char *pcVar4;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  
  WVar1 = this->xlib_drawable;
  pDVar2 = this->screen->display;
  p_Var3 = this->screen->gc;
  pcVar4 = source[1].title;
  set_gc_using_fill(this,&Am_No_Style,df,0);
  XCopyArea(pDVar2,pcVar4,WVar1,p_Var3,s_left,s_top,CONCAT44(in_register_0000000c,width),
            CONCAT44(in_register_00000084,height),d_left,d_top);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Bitblt(int d_left, int d_top, int width, int height,
                           Am_Drawonable *source, int s_left, int s_top,
                           Am_Draw_Function df)
{
  GC gc = screen->gc;
  Display *disp = screen->display;

  Window src_drawable = ((Am_Drawonable_Impl *)source)->xlib_drawable;
  Window dest_drawable = xlib_drawable;

  // a bit inefficient- only really need to change draw function.
  set_gc_using_fill(Am_No_Style, df);

  XCopyArea(disp, src_drawable, dest_drawable, gc, s_left, s_top, width, height,
            d_left, d_top);
}